

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,QJsonArray *a)

{
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QCborArray *in_stack_ffffffffffffffc8;
  QJsonArray local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCborArray::fromJsonArray(&local_10);
  QCborValue::QCborValue(in_RDI,in_stack_ffffffffffffffc8);
  QCborArray::~QCborArray((QCborArray *)0x1bcdb7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue::QJsonValue(const QJsonArray &a)
    : value(QCborArray::fromJsonArray(a))
{
}